

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetTxOutRecordKeyList
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this,uint32_t index)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  
  (*this->_vptr_Psbt[3])(this,(ulong)index,0xc3f,"GetTxOutRecordKeyList");
  pvVar2 = this->wally_psbt_pointer_;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = *(long *)((long)pvVar2 + 0x28) + (ulong)index * 0xd0;
  lVar4 = 8;
  for (uVar5 = 0; uVar5 < *(ulong *)(lVar1 + 0x40); uVar5 = uVar5 + 1) {
    lVar3 = *(long *)(lVar1 + 0x38);
    ByteData::ByteData((ByteData *)&_Stack_48,*(uint8_t **)(lVar3 + -8 + lVar4),
                       *(uint32_t *)(lVar3 + lVar4));
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(__return_storage_ptr__,(ByteData *)&_Stack_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_48);
    lVar4 = lVar4 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetTxOutRecordKeyList(uint32_t index) const {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;
  auto output = &psbt_pointer->outputs[index];
  for (size_t idx = 0; idx < output->unknowns.num_items; ++idx) {
    auto item = &output->unknowns.items[idx];
    result.emplace_back(
        ByteData(item->key, static_cast<uint32_t>(item->key_len)));
  }
  return result;
}